

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt.cpp
# Opt level: O3

long testDoubleToString(int count)

{
  __time_t _Var1;
  __suseconds_t _Var2;
  undefined8 in_RCX;
  long lVar3;
  timeval tv;
  string local_58;
  timeval local_38;
  
  gettimeofday(&local_38,(__timezone_ptr_t)0x0);
  _Var2 = local_38.tv_usec;
  _Var1 = local_38.tv_sec;
  if (0 < count) {
    do {
      FIX::DoubleConvertor::convert_abi_cxx11_
                (&local_58,(DoubleConvertor *)0x0,123.45,0xf,(int)in_RCX);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      count = count + -1;
    } while (count != 0);
  }
  lVar3 = SUB168(SEXT816(_Var2) * SEXT816(-0x20c49ba5e353f7cf),8);
  gettimeofday(&local_38,(__timezone_ptr_t)0x0);
  return (local_38.tv_sec - _Var1) * 1000 +
         local_38.tv_usec / 1000 + ((lVar3 >> 7) - (lVar3 >> 0x3f));
}

Assistant:

long testDoubleToString( int count )
{
  count = count - 1;

  long start = GetTickCount();
  for ( int i = 0; i <= count; ++i )
  {
    FIX::DoubleConvertor::convert( 123.45 );
  }
  return GetTickCount() - start;
}